

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O3

_Bool olsrv2_mpr_shall_forwarding
                (rfc5444_reader_tlvblock_context *context,netaddr *source_address,uint64_t vtime)

{
  netaddr *originator;
  byte bVar1;
  oonf_rfc5444_interface *poVar2;
  void *pvVar3;
  long lVar4;
  oonf_rfc5444_protocol *poVar5;
  int iVar6;
  oonf_duplicate_result oVar7;
  avl_tree *tree;
  avl_node *paVar8;
  char *pcVar9;
  void *pvVar10;
  char *pcVar11;
  bool bVar12;
  oonf_log_source oVar13;
  char *pcVar14;
  netaddr_str buf;
  
  poVar5 = _protocol;
  oVar13 = LOG_OLSRV2;
  if ((context->has_origaddr == true) && (context->has_seqno != false)) {
    poVar2 = (_protocol->input).interface;
    if (poVar2 == (oonf_rfc5444_interface *)0x0) {
      if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
        pcVar11 = "Do not forward because input interface is not set";
        iVar6 = 0x1c1;
        goto LAB_00131a22;
      }
    }
    else if (source_address == (netaddr *)0x0) {
      if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
        pcVar11 = "Do not forward because input source is not set";
        iVar6 = 0x1c7;
        goto LAB_00131a22;
      }
    }
    else {
      iVar6 = strcmp(poVar2->name,"any");
      if (iVar6 != 0) {
        originator = &context->orig_addr;
        oVar7 = oonf_duplicate_entry_add
                          (&poVar5->forwarded_set,context->msg_type,originator,(ulong)context->seqno
                           ,vtime + _olsrv2_config.f_hold_time);
        oVar13 = LOG_OLSRV2;
        if ((oVar7 < (OONF_DUPSET_NEWEST|OONF_DUPSET_NEW)) && ((0x34U >> (oVar7 & 0x1f) & 1) != 0))
        {
          poVar2 = (_protocol->input).interface;
          tree = nhdp_interface_get_tree();
          paVar8 = avl_find(tree,poVar2);
          if (paVar8 == (avl_node *)0x0) {
            if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
              pcVar11 = "Do not forward because NHDP does not handle interface \'%s\'";
              iVar6 = 0x1e1;
              oVar13 = LOG_OLSRV2;
              goto LAB_00131a22;
            }
          }
          else {
            paVar8 = avl_find((avl_tree *)(paVar8 + 2),source_address);
            oVar13 = LOG_OLSRV2;
            if (paVar8 == (avl_node *)0x0) {
              if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
                netaddr_to_prefixstring(&buf,source_address,false);
                pcVar11 = "Do not forward because source IP %s is not a direct neighbor";
                iVar6 = 0x1eb;
                goto LAB_00131a22;
              }
            }
            else {
              pvVar3 = paVar8[-3].key;
              pvVar10 = pvVar3;
              if (((context->orig_addr)._type == source_address->_type) ||
                 (pvVar10 = *(void **)((long)pvVar3 + 0x140), pvVar10 != (void *)0x0)) {
                lVar4 = *(long *)((long)pvVar10 + 0x148);
                if (*(char *)((long)pvVar3 + 0x180) == '\x01') {
                  bVar12 = 0 < *(int *)(lVar4 + 0x14);
                }
                else {
                  bVar12 = false;
                }
                if ((log_global_mask[LOG_OLSRV2] & 1) == 0) {
                  return bVar12;
                }
                pcVar11 = "not ";
                if (bVar12 != false) {
                  pcVar11 = "";
                }
                bVar1 = context->msg_type;
                pcVar9 = netaddr_to_prefixstring(&buf,originator,false);
                pcVar14 = "false";
                if (*(char *)((long)paVar8[-3].key + 0x180) != '\0') {
                  pcVar14 = "true";
                }
                oonf_log(LOG_SEVERITY_DEBUG,oVar13,"src/olsrv2/olsrv2/olsrv2.c",0x205,(void *)0x0,0,
                         "Do %sforward message type %u from %s with seqno %u (%s/%u)",pcVar11,
                         (ulong)bVar1,pcVar9,(ulong)context->seqno,pcVar14,
                         (ulong)*(uint *)(lVar4 + 0x14));
                return bVar12;
              }
              if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
                netaddr_to_prefixstring(&buf,source_address,false);
                pcVar11 = 
                "Do not forward because this is a dualstack message, but the link source %s is not dualstack capable"
                ;
                iVar6 = 0x1fb;
LAB_00131a22:
                oonf_log(LOG_SEVERITY_DEBUG,oVar13,"src/olsrv2/olsrv2/olsrv2.c",iVar6,(void *)0x0,0,
                         pcVar11);
                return false;
              }
            }
          }
        }
        else if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
          bVar1 = context->msg_type;
          pcVar11 = netaddr_to_prefixstring(&buf,originator,false);
          oonf_log(LOG_SEVERITY_DEBUG,oVar13,"src/olsrv2/olsrv2/olsrv2.c",0x1d7,(void *)0x0,0,
                   "Do not forward message type %u from %s with seqno %u (dupset result: %u)",
                   (ulong)bVar1,pcVar11,(ulong)context->seqno,(ulong)oVar7);
          return false;
        }
      }
    }
  }
  else if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
    pcVar11 = "Do not forward message type %u, originator or sequence number is missing!";
    iVar6 = 0x1bb;
    goto LAB_00131a22;
  }
  return false;
}

Assistant:

bool
olsrv2_mpr_shall_forwarding(
  struct rfc5444_reader_tlvblock_context *context, struct netaddr *source_address, uint64_t vtime) {
  struct nhdp_interface *interf;
  struct nhdp_laddr *laddr;
  struct nhdp_neighbor *neigh;
  enum oonf_duplicate_result dup_result;
  bool forward;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check input interface */
  if (_protocol->input.interface == NULL) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input interface is not set");
    return false;
  }

  /* check input source address */
  if (!source_address) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input source is not set");
    return false;
  }

  /* check if this is coming from the unicast receiver */
  if (strcmp(_protocol->input.interface->name, RFC5444_UNICAST_INTERFACE) == 0) {
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->forwarded_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  if (!oonf_duplicate_is_new(dup_result)) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u from %s"
      " with seqno %u (dupset result: %u)",
      context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
    return false;
  }

  /* get NHDP interface */
  interf = nhdp_interface_get(_protocol->input.interface->name);
  if (interf == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because NHDP does not handle"
      " interface '%s'",
      _protocol->input.interface->name);
    return false;
  }

  /* get NHDP link address corresponding to source */
  laddr = nhdp_interface_get_link_addr(interf, source_address);
  if (laddr == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because source IP %s is"
      " not a direct neighbor",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  if (netaddr_get_address_family(&context->orig_addr) == netaddr_get_address_family(source_address)) {
    /* get NHDP neighbor */
    neigh = laddr->link->neigh;
  }
  else if (laddr->link->dualstack_partner) {
    /* get dualstack NHDP neighbor */
    neigh = laddr->link->dualstack_partner->neigh;
  }
  else {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because this is a dualstack"
      " message, but the link source %s is not dualstack capable",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  /* forward if this neighbor has selected us as a flooding MPR */
  forward = laddr->link->local_is_flooding_mpr && neigh->symmetric > 0;
  OONF_DEBUG(LOG_OLSRV2,
    "Do %sforward message type %u from %s"
    " with seqno %u (%s/%u)",
    forward ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno,
    laddr->link->local_is_flooding_mpr ? "true" : "false", neigh->symmetric);
  return forward;
}